

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::computeNonProjectedTriLod
                (LodMode mode,IVec2 *dstSize,IVec3 *srcSize,Vec3 *sq,Vec3 *tq,Vec3 *rq)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float dy;
  float dx;
  float dwy;
  float dwx;
  float dvy;
  float dvx;
  float duy;
  float dux;
  Vec3 *rq_local;
  Vec3 *tq_local;
  Vec3 *sq_local;
  IVec3 *srcSize_local;
  IVec2 *dstSize_local;
  LodMode mode_local;
  
  fVar8 = tcu::Vector<float,_3>::z(sq);
  fVar9 = tcu::Vector<float,_3>::x(sq);
  iVar1 = tcu::Vector<int,_3>::x(srcSize);
  fVar10 = tcu::Vector<float,_3>::y(sq);
  fVar11 = tcu::Vector<float,_3>::x(sq);
  iVar2 = tcu::Vector<int,_3>::x(srcSize);
  fVar12 = tcu::Vector<float,_3>::z(tq);
  fVar13 = tcu::Vector<float,_3>::x(tq);
  iVar3 = tcu::Vector<int,_3>::y(srcSize);
  fVar14 = tcu::Vector<float,_3>::y(tq);
  fVar15 = tcu::Vector<float,_3>::x(tq);
  iVar4 = tcu::Vector<int,_3>::y(srcSize);
  fVar16 = tcu::Vector<float,_3>::z(rq);
  fVar17 = tcu::Vector<float,_3>::x(rq);
  iVar5 = tcu::Vector<int,_3>::z(srcSize);
  fVar18 = tcu::Vector<float,_3>::y(rq);
  fVar19 = tcu::Vector<float,_3>::x(rq);
  iVar6 = tcu::Vector<int,_3>::z(srcSize);
  iVar7 = tcu::Vector<int,_2>::x(dstSize);
  fVar20 = (float)iVar7;
  iVar7 = tcu::Vector<int,_2>::y(dstSize);
  fVar21 = (float)iVar7;
  fVar8 = computeLodFromDerivates
                    (mode,((fVar8 - fVar9) * (float)iVar1) / fVar20,
                     ((fVar12 - fVar13) * (float)iVar3) / fVar20,
                     ((fVar16 - fVar17) * (float)iVar5) / fVar20,
                     ((fVar10 - fVar11) * (float)iVar2) / fVar21,
                     ((fVar14 - fVar15) * (float)iVar4) / fVar21,
                     ((fVar18 - fVar19) * (float)iVar6) / fVar21);
  return fVar8;
}

Assistant:

static float computeNonProjectedTriLod (LodMode mode, const tcu::IVec2& dstSize, const tcu::IVec3& srcSize, const tcu::Vec3& sq, const tcu::Vec3& tq, const tcu::Vec3& rq)
{
	float dux	= (sq.z() - sq.x()) * (float)srcSize.x();
	float duy	= (sq.y() - sq.x()) * (float)srcSize.x();
	float dvx	= (tq.z() - tq.x()) * (float)srcSize.y();
	float dvy	= (tq.y() - tq.x()) * (float)srcSize.y();
	float dwx	= (rq.z() - rq.x()) * (float)srcSize.z();
	float dwy	= (rq.y() - rq.x()) * (float)srcSize.z();
	float dx	= (float)dstSize.x();
	float dy	= (float)dstSize.y();

	return computeLodFromDerivates(mode, dux/dx, dvx/dx, dwx/dx, duy/dy, dvy/dy, dwy/dy);
}